

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps3,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  long in_RDI;
  long in_R8;
  int *in_R9;
  uint *in_stack_00000008;
  long in_stack_00000028;
  cpp_dec_float<100U,_int,_void> *in_stack_00000030;
  cpp_dec_float<100U,_int,_void> *in_stack_00000038;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000040;
  long in_stack_00000058;
  int *in_stack_00000060;
  uint *in_stack_00000068;
  long in_stack_00000070;
  uint *in_stack_00000078;
  int *in_stack_00000080;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int *in_stack_00000bc0;
  int *in_stack_00000bc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000bd0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000bd8;
  int *in_stack_00000be0;
  int *in_stack_00000be8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000bf0;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff6c8;
  cpp_dec_float<100U,_int,_void> *pcVar5;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff6d0;
  cpp_dec_float<100U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  cpp_dec_float<100U,_int,_void> local_6f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff960;
  uint in_stack_fffffffffffff96c;
  int *in_stack_fffffffffffff970;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff978;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff980;
  cpp_dec_float<100U,_int,_void> local_658;
  undefined4 local_608 [41];
  undefined4 local_564 [41];
  undefined4 local_4c0 [31];
  int in_stack_fffffffffffffbbc;
  int *in_stack_fffffffffffffbc0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbc8;
  int *in_stack_fffffffffffffbd0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  int *local_378;
  uint local_360;
  int local_35c;
  undefined1 local_358 [160];
  undefined1 local_2b8 [80];
  undefined1 local_268 [80];
  int *local_218;
  long local_210;
  undefined1 *local_1e8;
  undefined4 *local_1e0;
  long local_1d8;
  undefined4 *local_1d0;
  long local_1c8;
  undefined4 *local_1c0;
  long local_1b8;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 *local_198;
  undefined1 *local_188;
  
  local_198 = local_268;
  local_218 = in_R9;
  local_210 = in_R8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  local_188 = local_2b8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  pcVar5 = in_stack_00000030;
  this_00 = in_stack_00000038;
  vSolveLright3((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)x.m_backend.data._M_elems._40_8_,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)x.m_backend.data._M_elems._32_8_,(int *)x.m_backend.data._M_elems._24_8_,
                (int *)x.m_backend.data._M_elems._16_8_,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)x.m_backend.data._M_elems._8_8_,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)x.m_backend.data._M_elems._0_8_,in_stack_00000bc0,in_stack_00000bc8,
                in_stack_00000bd0,in_stack_00000bd8,in_stack_00000be0,in_stack_00000be8,
                in_stack_00000bf0);
  local_1e8 = local_358;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00);
  lVar2 = *(long *)(in_RDI + 0x1a8);
  if (in_stack_00000070 == 0) {
    local_360 = 0;
    for (local_35c = 0; local_35c < (int)*in_stack_00000008; local_35c = local_35c + 1) {
      iVar1 = local_218[local_35c];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         in_stack_fffffffffffff768);
      if (bVar3) {
        enQueueMax(local_218,(int *)&local_360,*(int *)(lVar2 + (long)iVar1 * 4));
      }
      else {
        local_4c0[0] = 0;
        local_1b8 = local_210 + (long)iVar1 * 0x50;
        local_1c0 = local_4c0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_360;
  }
  else {
    local_378 = in_stack_00000080;
    local_360 = 0;
    for (local_35c = 0; local_35c < (int)*in_stack_00000008; local_35c = local_35c + 1) {
      iVar1 = local_218[local_35c];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         in_stack_fffffffffffff768);
      if (bVar3) {
        *local_378 = iVar1;
        enQueueMax(local_218,(int *)&local_360,*(int *)(lVar2 + (long)iVar1 * 4));
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
        local_378 = local_378 + 1;
      }
      else {
        in_stack_fffffffffffffbe4 = 0;
        local_1a8 = local_210 + (long)iVar1 * 0x50;
        local_1b0 = &stack0xfffffffffffffbe4;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_360;
    *in_stack_00000078 = local_360;
  }
  local_360 = 0;
  for (local_35c = 0; local_35c < (int)(in_stack_00000038->data)._M_elems[0];
      local_35c = local_35c + 1) {
    uVar4 = (in_stack_00000030->data)._M_elems[local_35c];
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                       in_stack_fffffffffffff768);
    if (bVar3) {
      enQueueMax((int *)in_stack_00000030,(int *)&local_360,*(int *)(lVar2 + (long)(int)uVar4 * 4));
    }
    else {
      local_564[0] = 0;
      local_1c8 = in_stack_00000028 + (long)(int)uVar4 * 0x50;
      local_1d0 = local_564;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (this_00,(long_long_type)pcVar5);
    }
  }
  (in_stack_00000038->data)._M_elems[0] = local_360;
  local_360 = 0;
  for (local_35c = 0; local_35c < (int)*in_stack_00000068; local_35c = local_35c + 1) {
    iVar1 = in_stack_00000060[local_35c];
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                       in_stack_fffffffffffff768);
    if (bVar3) {
      enQueueMax(in_stack_00000060,(int *)&local_360,*(int *)(lVar2 + (long)iVar1 * 4));
    }
    else {
      local_608[0] = 0;
      local_1d8 = in_stack_00000058 + (long)iVar1 * 0x50;
      local_1e0 = local_608;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (this_00,(long_long_type)pcVar5);
    }
  }
  *in_stack_00000068 = local_360;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_658;
  uVar4 = vSolveUright((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8
                       ,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_00000040);
  *in_stack_00000008 = uVar4;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = (cpp_dec_float<100U,_int,_void> *)&stack0xfffffffffffff958;
  uVar4 = vSolveUright((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8
                       ,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_00000040);
  (in_stack_00000038->data)._M_elems[0] = uVar4;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_6f8;
  uVar4 = vSolveUright((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8
                       ,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_00000040);
  *in_stack_00000068 = uVar4;
  if (*(int *)(in_RDI + 0x208) == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                              in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                              in_stack_fffffffffffff960);
    *in_stack_00000008 = uVar4;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                              in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                              in_stack_fffffffffffff960);
    (in_stack_00000038->data)._M_elems[0] = uVar4;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                              in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                              in_stack_fffffffffffff960);
    *in_stack_00000068 = uVar4;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}